

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O0

size_t __thiscall rtc::Buffer::size(Buffer *this)

{
  bool bVar1;
  ostream *poVar2;
  FatalMessage local_190;
  FatalMessageVoidify local_11;
  Buffer *local_10;
  Buffer *this_local;
  
  local_10 = this;
  bVar1 = IsConsistent(this);
  if (!bVar1) {
    FatalMessageVoidify::FatalMessageVoidify(&local_11);
    FatalMessage::FatalMessage
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/buffer.h"
               ,0x5c);
    poVar2 = FatalMessage::stream(&local_190);
    poVar2 = std::operator<<(poVar2,"Check failed: IsConsistent()");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"# ");
    FatalMessageVoidify::operator&(&local_11,poVar2);
    FatalMessage::~FatalMessage(&local_190);
  }
  return this->size_;
}

Assistant:

size_t size() const {
    RTC_DCHECK(IsConsistent());
    return size_;
  }